

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::initPrecompiledKernelOverrides(CLIntercept *this,cl_context context)

{
  char *pcVar1;
  mapped_type pSVar2;
  bool bVar3;
  mapped_type *ppSVar4;
  cl_icd_dispatch *pcVar5;
  cl_program p_Var6;
  SConfig *pSVar7;
  cl_kernel p_Var8;
  cl_context in_RSI;
  CLIntercept *in_RDI;
  double dVar9;
  char *buildLog;
  size_t buildLogSize;
  cl_uint i;
  cl_device_id *devices;
  cl_uint numDevices;
  cl_int tempErrorCode;
  size_t programStringLength;
  char *pProgramString;
  SPrecompiledKernelOverrides *pOverrides;
  cl_int errorCode;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffcc8;
  lock_guard<std::mutex> *in_stack_fffffffffffffcd0;
  allocator *paVar10;
  cl_icd_dispatch *in_stack_fffffffffffffd08;
  cl_kernel in_stack_fffffffffffffd10;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  char *local_90;
  size_t local_88;
  uint local_7c;
  void *local_78;
  uint local_70;
  cl_int local_6c;
  size_t local_68;
  char *local_60;
  mapped_type local_58;
  cl_int local_50 [5];
  allocator local_39;
  string local_38 [40];
  cl_context local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  std::allocator<char>::allocator();
  dVar9 = (double)std::__cxx11::string::string
                            (local_38,"Initializing precompiled kernel overrides...\n",&local_39);
  log(in_RDI,dVar9);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_50[0] = 0;
  ppSVar4 = std::
            map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
            ::operator[]((map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
                          *)in_stack_fffffffffffffd10,(key_type *)in_stack_fffffffffffffd08);
  local_58 = *ppSVar4;
  if (local_58 != (mapped_type)0x0) {
    pcVar5 = dispatch(in_RDI);
    local_50[0] = (*pcVar5->clReleaseKernel)(local_58->Kernel_CopyBufferBytes);
    pcVar5 = dispatch(in_RDI);
    local_50[0] = (*pcVar5->clReleaseKernel)(local_58->Kernel_CopyBufferUInts);
    pcVar5 = dispatch(in_RDI);
    local_50[0] = (*pcVar5->clReleaseKernel)(local_58->Kernel_CopyBufferUInt4s);
    pcVar5 = dispatch(in_RDI);
    local_50[0] = (*pcVar5->clReleaseKernel)(local_58->Kernel_CopyBufferUInt16s);
    pcVar5 = dispatch(in_RDI);
    local_50[0] = (*pcVar5->clReleaseKernel)(local_58->Kernel_CopyImage2Dto2DFloat);
    pcVar5 = dispatch(in_RDI);
    local_50[0] = (*pcVar5->clReleaseKernel)(local_58->Kernel_CopyImage2Dto2DInt);
    pcVar5 = dispatch(in_RDI);
    local_50[0] = (*pcVar5->clReleaseKernel)(local_58->Kernel_CopyImage2Dto2DUInt);
    pcVar5 = dispatch(in_RDI);
    local_50[0] = (*pcVar5->clReleaseProgram)(local_58->Program);
    if (local_58 != (mapped_type)0x0) {
      operator_delete(local_58);
    }
    local_58 = (mapped_type)0x0;
    ppSVar4 = std::
              map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
              ::operator[]((map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
                            *)in_stack_fffffffffffffd10,(key_type *)in_stack_fffffffffffffd08);
    *ppSVar4 = (mapped_type)0x0;
  }
  local_58 = (mapped_type)operator_new(0x40);
  if (local_58 != (mapped_type)0x0) {
    local_58->Program = (cl_program)0x0;
    local_58->Kernel_CopyBufferBytes = (cl_kernel)0x0;
    local_58->Kernel_CopyBufferUInts = (cl_kernel)0x0;
    local_58->Kernel_CopyBufferUInt4s = (cl_kernel)0x0;
    local_58->Kernel_CopyBufferUInt16s = (cl_kernel)0x0;
    local_58->Kernel_CopyImage2Dto2DFloat = (cl_kernel)0x0;
    local_58->Kernel_CopyImage2Dto2DInt = (cl_kernel)0x0;
    local_58->Kernel_CopyImage2Dto2DUInt = (cl_kernel)0x0;
    local_60 = (char *)0x0;
    local_68 = 0;
    if ((local_50[0] == 0) &&
       (bVar3 = ::OS::Services::GetPrecompiledKernelString(&in_RDI->m_OS,&local_60,&local_68),
       !bVar3)) {
      local_50[0] = -0x1e;
    }
    if (local_50[0] == 0) {
      pcVar5 = dispatch(in_RDI);
      p_Var6 = (*pcVar5->clCreateProgramWithSource)(local_10,1,&local_60,&local_68,local_50);
      local_58->Program = p_Var6;
    }
    if (local_50[0] == 0) {
      pcVar5 = dispatch(in_RDI);
      local_50[0] = (*pcVar5->clBuildProgram)
                              (local_58->Program,0,(cl_device_id *)0x0,(char *)0x0,
                               (_func_void_cl_program_void_ptr *)0x0,(void *)0x0);
      if (local_50[0] != 0) {
        local_6c = 0;
        local_70 = 0;
        pcVar5 = dispatch(in_RDI);
        local_6c = (*pcVar5->clGetContextInfo)(local_10,0x1083,4,&local_70,(size_t *)0x0);
        if ((local_70 != 0) &&
           (local_78 = operator_new__((ulong)local_70 << 3), local_78 != (void *)0x0)) {
          pcVar5 = dispatch(in_RDI);
          local_6c = (*pcVar5->clGetContextInfo)
                               (local_10,0x1081,(ulong)local_70 << 3,local_78,(size_t *)0x0);
          if (local_6c == 0) {
            for (local_7c = 0; local_7c < local_70; local_7c = local_7c + 1) {
              local_88 = 0;
              pcVar5 = dispatch(in_RDI);
              (*pcVar5->clGetProgramBuildInfo)
                        (local_58->Program,*(cl_device_id *)((long)local_78 + (ulong)local_7c * 8),
                         0x1183,0,(void *)0x0,&local_88);
              local_90 = (char *)operator_new__(local_88 + 1);
              if (local_90 != (char *)0x0) {
                pcVar5 = dispatch(in_RDI);
                (*pcVar5->clGetProgramBuildInfo)
                          (local_58->Program,*(cl_device_id *)((long)local_78 + (ulong)local_7c * 8)
                           ,0x1183,local_88,local_90,(size_t *)0x0);
                local_90[local_88] = '\0';
                std::allocator<char>::allocator();
                dVar9 = (double)std::__cxx11::string::string
                                          (local_b0,"-------> Start of Build Log:\n",&local_b1);
                log(in_RDI,dVar9);
                std::__cxx11::string::~string(local_b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_b1);
                pcVar1 = local_90;
                std::allocator<char>::allocator();
                dVar9 = (double)std::__cxx11::string::string(local_d8,pcVar1,&local_d9);
                log(in_RDI,dVar9);
                std::__cxx11::string::~string(local_d8);
                std::allocator<char>::~allocator((allocator<char> *)&local_d9);
                std::allocator<char>::allocator();
                dVar9 = (double)std::__cxx11::string::string
                                          (local_100,"<------- End of Build Log!\n",&local_101);
                log(in_RDI,dVar9);
                std::__cxx11::string::~string(local_100);
                std::allocator<char>::~allocator((allocator<char> *)&local_101);
                if (local_90 != (char *)0x0) {
                  operator_delete__(local_90);
                }
              }
            }
          }
        }
      }
    }
    pSVar7 = config(in_RDI);
    if ((((pSVar7->OverrideReadBuffer & 1U) != 0) ||
        (pSVar7 = config(in_RDI), (pSVar7->OverrideWriteBuffer & 1U) != 0)) ||
       (pSVar7 = config(in_RDI), (pSVar7->OverrideCopyBuffer & 1U) != 0)) {
      if (local_50[0] == 0) {
        pcVar5 = dispatch(in_RDI);
        p_Var8 = (*pcVar5->clCreateKernel)(local_58->Program,"CopyBufferBytes",local_50);
        local_58->Kernel_CopyBufferBytes = p_Var8;
      }
      if (local_50[0] == 0) {
        pcVar5 = dispatch(in_RDI);
        p_Var8 = (*pcVar5->clCreateKernel)(local_58->Program,"CopyBufferUInts",local_50);
        local_58->Kernel_CopyBufferUInts = p_Var8;
      }
      if (local_50[0] == 0) {
        pcVar5 = dispatch(in_RDI);
        p_Var8 = (*pcVar5->clCreateKernel)(local_58->Program,"CopyBufferUInt4s",local_50);
        local_58->Kernel_CopyBufferUInt4s = p_Var8;
      }
      if (local_50[0] == 0) {
        pcVar5 = dispatch(in_RDI);
        p_Var8 = (*pcVar5->clCreateKernel)(local_58->Program,"CopyBufferUInt16s",local_50);
        local_58->Kernel_CopyBufferUInt16s = p_Var8;
      }
    }
    pSVar7 = config(in_RDI);
    if ((((pSVar7->OverrideReadImage & 1U) != 0) ||
        (pSVar7 = config(in_RDI), (pSVar7->OverrideWriteImage & 1U) != 0)) ||
       (pSVar7 = config(in_RDI), (pSVar7->OverrideCopyImage & 1U) != 0)) {
      if (local_50[0] == 0) {
        pcVar5 = dispatch(in_RDI);
        in_stack_fffffffffffffd10 =
             (*pcVar5->clCreateKernel)(local_58->Program,"CopyImage2Dto2DFloat",local_50);
        local_58->Kernel_CopyImage2Dto2DFloat = in_stack_fffffffffffffd10;
      }
      if (local_50[0] == 0) {
        in_stack_fffffffffffffd08 = dispatch(in_RDI);
        p_Var8 = (*in_stack_fffffffffffffd08->clCreateKernel)
                           (local_58->Program,"CopyImage2Dto2DInt",local_50);
        local_58->Kernel_CopyImage2Dto2DInt = p_Var8;
      }
      if (local_50[0] == 0) {
        pcVar5 = dispatch(in_RDI);
        p_Var8 = (*pcVar5->clCreateKernel)(local_58->Program,"CopyImage2Dto2DUInt",local_50);
        local_58->Kernel_CopyImage2Dto2DUInt = p_Var8;
      }
    }
    pSVar2 = local_58;
    if (local_50[0] == 0) {
      ppSVar4 = std::
                map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
                ::operator[]((map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
                              *)in_stack_fffffffffffffd10,(key_type *)in_stack_fffffffffffffd08);
      *ppSVar4 = pSVar2;
    }
    else {
      if (local_58 != (mapped_type)0x0) {
        operator_delete(local_58);
      }
      local_58 = (mapped_type)0x0;
    }
  }
  paVar10 = &local_129;
  std::allocator<char>::allocator();
  dVar9 = (double)std::__cxx11::string::string
                            (local_128,"... precompiled kernel override initialization complete.\n",
                             paVar10);
  log(in_RDI,dVar9);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x215235);
  return;
}

Assistant:

void CLIntercept::initPrecompiledKernelOverrides(
    const cl_context context )
{
    std::lock_guard<std::mutex> lock(m_Mutex);
    log( "Initializing precompiled kernel overrides...\n" );

    cl_int  errorCode = CL_SUCCESS;

    // Check to see if overrides already exist.  If they do, release them.
    SPrecompiledKernelOverrides*    pOverrides =
        m_PrecompiledKernelOverridesMap[ context ];
    if( pOverrides )
    {
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyBufferBytes );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyBufferUInts );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyBufferUInt4s );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyBufferUInt16s );

        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyImage2Dto2DFloat );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyImage2Dto2DInt );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyImage2Dto2DUInt );

        errorCode = dispatch().clReleaseProgram( pOverrides->Program );

        delete pOverrides;
        pOverrides = NULL;

        m_PrecompiledKernelOverridesMap[ context ] = NULL;
    }

    // Allocate new overrides.
    pOverrides = new SPrecompiledKernelOverrides;
    if( pOverrides )
    {
        pOverrides->Program = NULL;

        pOverrides->Kernel_CopyBufferBytes = NULL;
        pOverrides->Kernel_CopyBufferUInts = NULL;
        pOverrides->Kernel_CopyBufferUInt4s = NULL;
        pOverrides->Kernel_CopyBufferUInt16s = NULL;

        pOverrides->Kernel_CopyImage2Dto2DFloat = NULL;
        pOverrides->Kernel_CopyImage2Dto2DInt = NULL;
        pOverrides->Kernel_CopyImage2Dto2DUInt = NULL;

        const char* pProgramString = NULL;
        size_t  programStringLength = 0;

        // Get the precompiled kernel string.
        if( errorCode == CL_SUCCESS )
        {
            if( m_OS.GetPrecompiledKernelString(
                    pProgramString,
                    programStringLength ) == false )
            {
                errorCode = CL_INVALID_VALUE;
            }
        }

        // Create the program:
        if( errorCode == CL_SUCCESS )
        {
            pOverrides->Program = dispatch().clCreateProgramWithSource(
                context,
                1,
                &pProgramString,
                &programStringLength,
                &errorCode );
        }

        // Build the program:
        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clBuildProgram(
                pOverrides->Program,
                0,
                NULL,
                NULL,
                NULL,
                NULL );

            if( errorCode != CL_SUCCESS )
            {
                cl_int  tempErrorCode = CL_SUCCESS;

                // Get the number of devices for this context.
                cl_uint numDevices = 0;
                tempErrorCode = dispatch().clGetContextInfo(
                    context,
                    CL_CONTEXT_NUM_DEVICES,
                    sizeof( numDevices ),
                    &numDevices,
                    NULL );

                if( numDevices != 0 )
                {
                    cl_device_id*   devices = new cl_device_id[ numDevices ];
                    if( devices )
                    {
                        tempErrorCode = dispatch().clGetContextInfo(
                            context,
                            CL_CONTEXT_DEVICES,
                            numDevices * sizeof( cl_device_id ),
                            devices,
                            NULL );

                        if( tempErrorCode == CL_SUCCESS )
                        {
                            for( cl_uint i = 0; i < numDevices; i++ )
                            {
                                size_t  buildLogSize = 0;
                                dispatch().clGetProgramBuildInfo(
                                    pOverrides->Program,
                                    devices[ i ],
                                    CL_PROGRAM_BUILD_LOG,
                                    0,
                                    NULL,
                                    &buildLogSize );

                                char*   buildLog = new char[ buildLogSize + 1 ];
                                if( buildLog )
                                {
                                    dispatch().clGetProgramBuildInfo(
                                        pOverrides->Program,
                                        devices[ i ],
                                        CL_PROGRAM_BUILD_LOG,
                                        buildLogSize * sizeof( char ),
                                        buildLog,
                                        NULL );

                                    buildLog[ buildLogSize ] = '\0';

                                    log( "-------> Start of Build Log:\n" );
                                    log( buildLog );
                                    log( "<------- End of Build Log!\n" );

                                    delete [] buildLog;
                                }
                            }
                        }
                    }
                }
            }
        }

        // Create all of the kernels in the program:

        if( config().OverrideReadBuffer ||
            config().OverrideWriteBuffer ||
            config().OverrideCopyBuffer )
        {
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyBufferBytes = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyBufferBytes",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyBufferUInts = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyBufferUInts",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyBufferUInt4s = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyBufferUInt4s",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyBufferUInt16s = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyBufferUInt16s",
                    &errorCode );
            }
        }

        if( config().OverrideReadImage ||
            config().OverrideWriteImage ||
            config().OverrideCopyImage )
        {
            // TODO: Check to see if images are supported?
            //       What should happen if this is a multiple-device context,
            //       and one device supports images, but another doesn't?

            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyImage2Dto2DFloat = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyImage2Dto2DFloat",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyImage2Dto2DInt = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyImage2Dto2DInt",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyImage2Dto2DUInt = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyImage2Dto2DUInt",
                    &errorCode );
            }
        }

        if( errorCode == CL_SUCCESS )
        {
            m_PrecompiledKernelOverridesMap[ context ] = pOverrides;
        }
        else
        {
            delete pOverrides;
            pOverrides = NULL;
        }
    }

    log( "... precompiled kernel override initialization complete.\n" );
}